

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O0

double fpconv_strtod(char *nptr,char **endptr)

{
  int iVar1;
  char *pcVar2;
  double value;
  int buflen;
  char *dp;
  char *endbuf;
  char *buf;
  char localbuf [32];
  char **endptr_local;
  char *nptr_local;
  
  if (locale_decimal_point == '.') {
    nptr_local = (char *)strtod(nptr,endptr);
  }
  else {
    iVar1 = strtod_buffer_size(nptr);
    if (iVar1 == 0) {
      *endptr = nptr;
      nptr_local = (char *)0x0;
    }
    else {
      if (iVar1 < 0x20) {
        endbuf = (char *)&buf;
      }
      else {
        endbuf = (char *)malloc((long)(iVar1 + 1));
        if (endbuf == (char *)0x0) {
          fprintf(_stderr,"Out of memory");
          abort();
        }
      }
      memcpy(endbuf,nptr,(long)iVar1);
      endbuf[iVar1] = '\0';
      pcVar2 = strchr(endbuf,0x2e);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = locale_decimal_point;
      }
      nptr_local = (char *)strtod(endbuf,&dp);
      *endptr = nptr + ((long)dp - (long)endbuf);
      if (0x1f < iVar1) {
        free(endbuf);
      }
    }
  }
  return (double)nptr_local;
}

Assistant:

double fpconv_strtod(const char *nptr, char **endptr)
{
    char localbuf[FPCONV_G_FMT_BUFSIZE];
    char *buf, *endbuf, *dp;
    int buflen;
    double value;

    /* System strtod() is fine when decimal point is '.' */
    if (locale_decimal_point == '.')
        return strtod(nptr, endptr);

    buflen = strtod_buffer_size(nptr);
    if (!buflen) {
        /* No valid characters found, standard strtod() return */
        *endptr = (char *)nptr;
        return 0;
    }

    /* Duplicate number into buffer */
    if (buflen >= FPCONV_G_FMT_BUFSIZE) {
        /* Handle unusually large numbers */
        buf = (char *)malloc(buflen + 1);
        if (!buf) {
            fprintf(stderr, "Out of memory");
            abort();
        }
    } else {
        /* This is the common case.. */
        buf = localbuf;
    }
    memcpy(buf, nptr, buflen);
    buf[buflen] = 0;

    /* Update decimal point character if found */
    dp = strchr(buf, '.');
    if (dp)
        *dp = locale_decimal_point;

    value = strtod(buf, &endbuf);
    *endptr = (char *)&nptr[endbuf - buf];
    if (buflen >= FPCONV_G_FMT_BUFSIZE)
        free(buf);

    return value;
}